

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime-c.cpp
# Opt level: O1

duckdb_timestamp_struct duckdb_from_timestamp(duckdb_timestamp ts)

{
  duckdb_time_struct dVar1;
  duckdb_timestamp_struct dVar2;
  date_t date;
  dtime_t time;
  duckdb_date local_1c;
  duckdb_time local_18;
  
  duckdb::Timestamp::Convert((timestamp_t)ts.micros,(date_t *)&local_1c,(dtime_t *)&local_18);
  dVar2.date = duckdb_from_date(local_1c);
  dVar1 = duckdb_from_time(local_18);
  dVar2.time = dVar1;
  return dVar2;
}

Assistant:

duckdb_timestamp_struct duckdb_from_timestamp(duckdb_timestamp ts) {
	date_t date;
	dtime_t time;
	Timestamp::Convert(timestamp_t(ts.micros), date, time);

	duckdb_date ddate;
	ddate.days = date.days;

	duckdb_time dtime;
	dtime.micros = time.micros;

	duckdb_timestamp_struct result;
	result.date = duckdb_from_date(ddate);
	result.time = duckdb_from_time(dtime);
	return result;
}